

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

void __thiscall dgPolyhedra::DeleteEdge(dgPolyhedra *this,dgEdge *edge)

{
  dgEdge *info;
  dgEdge *pdVar1;
  dgEdge *pdVar2;
  dgTreeNode *node;
  dgTreeNode *node_00;
  
  info = edge->m_twin;
  pdVar1 = edge->m_prev;
  pdVar2 = info->m_next;
  pdVar1->m_next = pdVar2;
  pdVar2->m_prev = pdVar1;
  pdVar1 = info->m_prev;
  pdVar2 = edge->m_next;
  pdVar2->m_prev = pdVar1;
  pdVar1->m_next = pdVar2;
  node = dgTree<dgEdge,_long>::GetNodeFromInfo(&this->super_dgTree<dgEdge,_long>,edge);
  node_00 = dgTree<dgEdge,_long>::GetNodeFromInfo(&this->super_dgTree<dgEdge,_long>,info);
  if (&node->m_info != edge) {
    __assert_fail("&nodeA->GetInfo() == edge",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0x814,"void dgPolyhedra::DeleteEdge(dgEdge *const)");
  }
  if (&node_00->m_info == info) {
    dgTree<dgEdge,_long>::Remove(&this->super_dgTree<dgEdge,_long>,node);
    dgTree<dgEdge,_long>::Remove(&this->super_dgTree<dgEdge,_long>,node_00);
    return;
  }
  __assert_fail("&nodeB->GetInfo() == twin",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                ,0x815,"void dgPolyhedra::DeleteEdge(dgEdge *const)");
}

Assistant:

void dgPolyhedra::DeleteEdge (dgEdge* const edge)
{
	dgEdge *const twin = edge->m_twin;

	edge->m_prev->m_next = twin->m_next;
	twin->m_next->m_prev = edge->m_prev;
	edge->m_next->m_prev = twin->m_prev;
	twin->m_prev->m_next = edge->m_next;

	dgTreeNode *const nodeA = GetNodeFromInfo (*edge);
	dgTreeNode *const nodeB = GetNodeFromInfo (*twin);

	HACD_ASSERT (&nodeA->GetInfo() == edge);
	HACD_ASSERT (&nodeB->GetInfo() == twin);

	Remove (nodeA);
	Remove (nodeB);
}